

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O0

void __thiscall Lodtalk::SpecialRuntimeObjects::~SpecialRuntimeObjects(SpecialRuntimeObjects *this)

{
  SpecialRuntimeObjects *this_local;
  
  std::vector<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>::~vector
            (&this->specialClassTable);
  std::vector<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>::~vector(&this->specialObjectTable);
  return;
}

Assistant:

SpecialRuntimeObjects::~SpecialRuntimeObjects()
{
}